

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Variant.hpp
# Opt level: O2

int __thiscall Variant::toInt(Variant *this)

{
  Data *pDVar1;
  uint uVar2;
  int iVar3;
  
  pDVar1 = this->data;
  uVar2 = 0;
  switch(pDVar1->type) {
  case boolType:
    uVar2 = (uint)(pDVar1->data).boolData;
    break;
  case doubleType:
    return (int)(pDVar1->data).doubleData;
  case intType:
  case uintType:
  case int64Type:
  case uint64Type:
    return (pDVar1->data).intData;
  case stringType:
    iVar3 = String::toInt((String *)(pDVar1 + 1));
    return iVar3;
  }
  return uVar2;
}

Assistant:

int toInt() const
  {
    switch(data->type)
    {
    case boolType: return data->data.boolData ? 1 : 0;
    case doubleType: return (int)data->data.doubleData;
    case intType: return data->data.intData;
    case uintType: return (int)data->data.uintData;
    case int64Type: return (int)data->data.int64Data;
    case uint64Type: return (int)data->data.uint64Data;
    case stringType: return ((const String*)(data + 1))->toInt();
    default:
      return 0;
    }
  }